

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboApiTest.cpp
# Opt level: O0

void deqp::gles2::Functional::textureLevelsWithRenderToMipmapTest
               (TestContext *testCtx,Context *context)

{
  bool bVar1;
  GLenum expect;
  int local_24;
  int ndx;
  deUint32 fbo;
  deUint32 tex;
  Context *context_local;
  TestContext *testCtx_local;
  
  (*context->_vptr_Context[6])(context,0xde1,1);
  (*context->_vptr_Context[0x7e])(context,0xde1,0,0x1907,0x100);
  (*context->_vptr_Context[0x7e])(context,0xde1,1,0x1907,0x80);
  (*context->_vptr_Context[9])(context,0x8d40,1);
  for (local_24 = 0; local_24 < 7; local_24 = local_24 + 1) {
    (*context->_vptr_Context[0x1e])
              (context,0x8d40,0x8ce0,0xde1,1,
               (ulong)(uint)textureLevelsWithRenderToMipmapTest::levels[local_24]);
    bVar1 = de::inBounds<int>(textureLevelsWithRenderToMipmapTest::levels[local_24],0,0x10);
    expect = 0x501;
    if (bVar1) {
      expect = 0;
    }
    checkError(testCtx,context,expect);
  }
  return;
}

Assistant:

static void textureLevelsWithRenderToMipmapTest (tcu::TestContext& testCtx, sglr::Context& context)
{
	deUint32	tex		= 1;
	deUint32	fbo		= 1;

	context.bindTexture(GL_TEXTURE_2D, tex);
	context.texImage2D(GL_TEXTURE_2D, 0, GL_RGB, 256, 256);
	context.texImage2D(GL_TEXTURE_2D, 1, GL_RGB, 128, 128);

	context.bindFramebuffer(GL_FRAMEBUFFER, fbo);

	static int levels[] = { 2, 1, 0, -1, 0x7fffffff, 0, 1 };

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(levels); ndx++)
	{
		context.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, tex, levels[ndx]);
		checkError(testCtx, context, de::inBounds(levels[ndx], 0, 16) ? GL_NO_ERROR : GL_INVALID_VALUE);
	}
}